

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

bool jsonip::parser::notchar_<(char)10>::
     match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state)

{
  Reader *pRVar1;
  bool bVar2;
  
  pRVar1 = state->reader_;
  if (((long)pRVar1->pos_ - (long)pRVar1->buf_ != pRVar1->len_) &&
     (bVar2 = ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::match_at_pos(state,'\n'),
     !bVar2)) {
    ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::advance(state);
    return true;
  }
  return false;
}

Assistant:

static inline bool match(S& state)
        {
            if (state.at_end()) return false;

            if (state.match_at_pos(c)) return false;
            state.advance();
            return true;
        }